

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Min2<0>::propagate(Min2<0> *this)

{
  IntVar *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  TrailElem local_28;
  
  pIVar1 = (this->x).var;
  iVar4 = (pIVar1->max).v;
  if (iVar4 < (((this->z).var)->max).v) {
    if (so.lazy) {
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])();
      lVar7 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar7 = 0;
    }
    pIVar1 = (this->z).var;
    iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,(long)iVar4,lVar7,1);
    if ((char)iVar4 != '\0') goto LAB_001b2190;
LAB_001b2335:
    bVar2 = false;
  }
  else {
LAB_001b2190:
    pIVar1 = (this->y).var;
    iVar4 = (pIVar1->max).v;
    if (iVar4 < (((this->z).var)->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])();
        lVar7 = (long)iVar3 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->z).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar1,(long)iVar4,lVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001b2335;
    }
    pIVar1 = (this->x).var;
    iVar4 = (pIVar1->min).v;
    iVar3 = (((this->y).var)->min).v;
    if (iVar4 < iVar3) {
      iVar3 = iVar4;
    }
    if ((((this->z).var)->min).v < iVar3) {
      lVar7 = (long)iVar3;
      if (so.lazy == true) {
        iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xb])(pIVar1,lVar7);
        pIVar1 = (this->y).var;
        uVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xb])(pIVar1,lVar7);
        uVar6 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      }
      else {
        uVar6 = 0;
      }
      pIVar1 = (this->z).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar7,uVar6,1);
      if ((char)iVar4 == '\0') goto LAB_001b2335;
    }
    pIVar1 = (this->z).var;
    iVar4 = (pIVar1->min).v;
    if ((((this->x).var)->min).v < iVar4) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
        lVar7 = (long)iVar3 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->x).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar1,(long)iVar4,lVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001b2335;
    }
    pIVar1 = (this->z).var;
    iVar4 = (pIVar1->min).v;
    if ((((this->y).var)->min).v < iVar4) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
        lVar7 = (long)iVar3 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->y).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar1,(long)iVar4,lVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001b2335;
    }
    iVar4 = (((this->z).var)->min).v;
    if ((iVar4 == (((this->x).var)->max).v) || (bVar2 = true, iVar4 == (((this->y).var)->max).v)) {
      local_28.pt = (int *)&(this->super_Propagator).satisfied;
      local_28.x = (int)(this->super_Propagator).satisfied.v;
      local_28.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_28);
      (this->super_Propagator).satisfied.v = '\x01';
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(b_i))

		setDom(z, setMax, x.getMax(), x.getMaxLit());
		setDom(z, setMax, y.getMax(), y.getMaxLit());

		const int64_t m = (x.getMin() < y.getMin() ? x.getMin() : y.getMin());
		setDom(z, setMin, m, x.getFMinLit(m), y.getFMinLit(m));

		setDom(x, setMin, z.getMin(), z.getMinLit());
		setDom(y, setMin, z.getMin(), z.getMinLit());

		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}

		return true;
	}